

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O3

MPP_RET hal_task_get_hnd(HalTaskGroup group,RK_S32 status,HalTaskHnd *hnd)

{
  long lVar1;
  HalTaskHnd pvVar2;
  MPP_RET MVar3;
  undefined8 in_RAX;
  undefined4 uVar4;
  spinlock_t *lock;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((hnd == (HalTaskHnd *)0x0 || group == (HalTaskGroup)0x0) || 2 < status) {
    _mpp_log_l(2,"hal_task","found invaid input group %p status %d hnd %p\n","hal_task_get_hnd",
               group,status,hnd);
    MVar3 = MPP_ERR_UNKNOW;
  }
  else {
    *hnd = (HalTaskHnd)0x0;
    lVar1 = *(long *)((long)group + 0x28);
    lock = (spinlock_t *)((long)group + 8);
    mpp_spinlock_lock(lock);
    pvVar2 = *(HalTaskHnd *)(lVar1 + (long)status * 0x10);
    if (pvVar2 == (HalTaskHnd)(lVar1 + (long)status * 0x10)) {
      mpp_spinlock_unlock(lock);
      MVar3 = MPP_NOK;
    }
    else {
      if (*(int *)((long)pvVar2 + 0x1c) != status) {
        _mpp_log_l(2,"hal_task","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "task->status == status","hal_task_get_hnd",CONCAT44(uVar4,0x8a));
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
      }
      *hnd = pvVar2;
      mpp_spinlock_unlock(lock);
      MVar3 = MPP_OK;
    }
  }
  return MVar3;
}

Assistant:

MPP_RET hal_task_get_hnd(HalTaskGroup group, RK_S32 status, HalTaskHnd *hnd)
{
    if (NULL == group || status >= TASK_BUTT || NULL == hnd) {
        mpp_err_f("found invaid input group %p status %d hnd %p\n", group, status, hnd);
        return MPP_ERR_UNKNOW;
    }

    *hnd = NULL;
    HalTaskGroupImpl *p = (HalTaskGroupImpl *)group;
    struct list_head *list = &p->list[status];

    mpp_spinlock_lock(&p->lock);
    if (list_empty(list)) {
        mpp_spinlock_unlock(&p->lock);
        return MPP_NOK;
    }

    HalTaskImpl *task = list_entry(list->next, HalTaskImpl, list);
    mpp_assert(task->status == status);
    *hnd = task;
    mpp_spinlock_unlock(&p->lock);
    return MPP_OK;
}